

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O0

ROMInfo ** MT32Emu::ROMInfo::getROMInfoList(Bit32u types,Bit32u pairTypes)

{
  uint uVar1;
  undefined1 auVar2 [16];
  ROMInfoLists *pRVar3;
  ulong uVar4;
  ROMInfo **ppRVar5;
  ROMInfo *pRVar6;
  ROMInfo *romInfo;
  ROMInfo **ppRStack_28;
  Bit32u i;
  ROMInfo **currentROMInList;
  ROMInfo **romInfoList;
  Bit32u romCount;
  Bit32u pairTypes_local;
  Bit32u types_local;
  
  pRVar3 = getROMInfoLists();
  uVar1 = (pRVar3->allROMInfos).itemCount;
  auVar2 = ZEXT416(uVar1 + 1) * ZEXT816(8);
  uVar4 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  ppRVar5 = (ROMInfo **)operator_new__(uVar4);
  ppRStack_28 = ppRVar5;
  for (romInfo._4_4_ = 0; romInfo._4_4_ < uVar1; romInfo._4_4_ = romInfo._4_4_ + 1) {
    pRVar6 = getKnownROMInfoFromList(romInfo._4_4_);
    if (((types & 1 << ((byte)pRVar6->type & 0x1f)) != 0) &&
       ((pairTypes & 1 << ((byte)pRVar6->pairType & 0x1f)) != 0)) {
      *ppRStack_28 = pRVar6;
      ppRStack_28 = ppRStack_28 + 1;
    }
  }
  *ppRStack_28 = (ROMInfo *)0x0;
  return ppRVar5;
}

Assistant:

const ROMInfo **ROMInfo::getROMInfoList(Bit32u types, Bit32u pairTypes) {
	Bit32u romCount = getROMInfoLists().allROMInfos.itemCount; // Excludes the NULL terminator.
	const ROMInfo **romInfoList = new const ROMInfo*[romCount + 1];
	const ROMInfo **currentROMInList = romInfoList;
	for (Bit32u i = 0; i < romCount; i++) {
		const ROMInfo *romInfo = getKnownROMInfoFromList(i);
		if ((types & (1 << romInfo->type)) && (pairTypes & (1 << romInfo->pairType))) {
			*currentROMInList++ = romInfo;
		}
	}
	*currentROMInList = NULL;
	return romInfoList;
}